

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O2

ktx_error_code_e
ktxTexture1_IterateLoadLevelFaces(ktxTexture1 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktxTexture1 *pkVar1;
  ktx_error_code_e kVar2;
  khronos_uint32_t *pData32;
  byte bVar3;
  uint uVar4;
  ktx_uint32_t kVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ktx_uint32_t faceLodSize;
  ktx_uint32_t local_74;
  uint local_70;
  uint local_6c;
  ktxStream *local_68;
  ktxTexture_protected *local_60;
  ulong local_58;
  ktxTexture1_private *local_50;
  ktxTexture1 *local_48;
  PFNKTXITERCB local_40;
  void *local_38;
  
  kVar2 = KTX_INVALID_OPERATION;
  if (This->classId == ktxTexture1_c) {
    if (iterCb == (PFNKTXITERCB)0x0) {
      kVar2 = KTX_INVALID_VALUE;
    }
    else {
      local_60 = This->_protected;
      if ((local_60->_stream).data.file != (FILE *)0x0) {
        local_50 = This->_private;
        local_68 = &local_60->_stream;
        pData32 = (khronos_uint32_t *)0x0;
        kVar2 = KTX_SUCCESS;
        local_70 = 0;
        uVar4 = 0;
        local_48 = This;
        local_40 = iterCb;
        local_38 = userdata;
        while (pkVar1 = local_48, uVar4 < local_48->numLevels) {
          bVar3 = (byte)uVar4;
          uVar7 = local_48->baseWidth >> (bVar3 & 0x1f);
          uVar8 = local_48->baseHeight >> (bVar3 & 0x1f);
          uVar6 = local_48->baseDepth >> (bVar3 & 0x1f);
          local_6c = uVar4;
          kVar2 = (*local_68->read)(local_68,&faceLodSize,4);
          if (kVar2 != KTX_SUCCESS) break;
          if (local_50->_needSwap == true) {
            _ktxSwapEndian32(&faceLodSize,1);
          }
          local_58 = (ulong)faceLodSize;
          if (pData32 == (khronos_uint32_t *)0x0) {
            pData32 = (khronos_uint32_t *)malloc(local_58);
            local_70 = (uint)local_58;
            if (pData32 == (khronos_uint32_t *)0x0) {
              pData32 = (khronos_uint32_t *)0x0;
              kVar2 = KTX_OUT_OF_MEMORY;
              break;
            }
          }
          else if (local_70 < faceLodSize) {
            kVar2 = KTX_FILE_DATA_ERROR;
            break;
          }
          local_74 = 1;
          if ((pkVar1->isCubemap == true) && (local_74 = 1, pkVar1->isArray == false)) {
            local_74 = pkVar1->numFaces;
          }
          kVar2 = KTX_SUCCESS;
          for (kVar5 = 0; local_74 != kVar5; kVar5 = kVar5 + 1) {
            kVar2 = (*local_68->read)(local_68,pData32,local_58);
            if (kVar2 != KTX_SUCCESS) goto LAB_001fb224;
            if (local_50->_needSwap == true) {
              if (local_60->_typeSize == 4) {
                _ktxSwapEndian32(pData32,(ulong)(faceLodSize >> 2));
              }
              else if (local_60->_typeSize == 2) {
                _ktxSwapEndian16((khronos_uint16_t *)pData32,(ulong)(faceLodSize >> 1));
              }
            }
            kVar2 = (*local_40)(local_6c,kVar5,uVar7 + (uVar7 == 0),uVar8 + (uVar8 == 0),
                                uVar6 + (uVar6 == 0),(ktx_uint64_t)faceLodSize,pData32,local_38);
          }
          uVar4 = local_6c + 1;
        }
LAB_001fb224:
        free(pData32);
        (*(local_60->_stream).destruct)(local_68);
      }
    }
  }
  return kVar2;
}

Assistant:

KTX_error_code
ktxTexture1_IterateLoadLevelFaces(ktxTexture1* This, PFNKTXITERCB iterCb,
                                  void* userdata)
{
    DECLARE_PRIVATE(ktxTexture1);
    struct ktxTexture_protected* prtctd = This->_protected;
    ktxStream* stream = (ktxStream *)&prtctd->_stream;
    ktx_uint32_t    dataSize = 0;
    ktx_uint32_t    miplevel;
    KTX_error_code  result = KTX_SUCCESS;
    void*           data = NULL;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (This->classId != ktxTexture1_c)
        return KTX_INVALID_OPERATION;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    if (prtctd->_stream.data.file == NULL)
        // This Texture not created from a stream or images are already loaded.
        return KTX_INVALID_OPERATION;

    for (miplevel = 0; miplevel < This->numLevels; ++miplevel)
    {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t faceLodSizePadded;
        ktx_uint32_t face;
        ktx_uint32_t innerIterations;
        GLsizei      width, height, depth;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> miplevel);
        height = MAX(1, This->baseHeight >> miplevel);
        depth = MAX(1, This->baseDepth  >> miplevel);

        result = stream->read(stream, &faceLodSize, sizeof(ktx_uint32_t));
        if (result != KTX_SUCCESS) {
            goto cleanup;
        }
        if (private->_needSwap) {
            _ktxSwapEndian32(&faceLodSize, 1);
        }
#if (KTX_GL_UNPACK_ALIGNMENT != 4)
        faceLodSizePadded = _KTX_PAD4(faceLodSize);
#else
        faceLodSizePadded = faceLodSize;
#endif
        if (!data) {
            /* allocate memory sufficient for the base miplevel */
            data = malloc(faceLodSizePadded);
            if (!data) {
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
            }
            dataSize = faceLodSizePadded;
        }
        else if (dataSize < faceLodSizePadded) {
            /* subsequent miplevels cannot be larger than the base miplevel */
            result = KTX_FILE_DATA_ERROR;
            goto cleanup;
        }

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        if (This->isCubemap && !This->isArray)
            innerIterations = This->numFaces;
        else
            innerIterations = 1;
        for (face = 0; face < innerIterations; ++face)
        {
            /* And all z_slices are also passed as a group hence no
             *    for (z_slice = 0; z_slice < This->depth)
             */
            result = stream->read(stream, data, faceLodSizePadded);
            if (result != KTX_SUCCESS) {
                goto cleanup;
            }

            /* Perform endianness conversion on texture data */
            if (private->_needSwap) {
                if (prtctd->_typeSize == 2)
                    _ktxSwapEndian16((ktx_uint16_t*)data, faceLodSize / 2);
                else if (prtctd->_typeSize == 4)
                    _ktxSwapEndian32((ktx_uint32_t*)data, faceLodSize / 4);
            }

            result = iterCb(miplevel, face,
                             width, height, depth,
                             faceLodSize, data, userdata);
        }
    }

cleanup:
    free(data);
    // No further need for this.
    stream->destruct(stream);

    return result;
}